

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::SourceCodeInfo_Location::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  LogMessageFatal local_20;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 6));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[6]._internal_metadata_);
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x389b,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void SourceCodeInfo_Location::SharedDtor(MessageLite& self) {
  SourceCodeInfo_Location& this_ = static_cast<SourceCodeInfo_Location&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.leading_comments_.Destroy();
  this_._impl_.trailing_comments_.Destroy();
  this_._impl_.~Impl_();
}